

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

vector<Scope,_std::allocator<Scope>_> * __thiscall
TreeIncPruneBGPlanner::GetValidActions
          (TreeIncPruneBGPlanner *this,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  int iVar1;
  const_reference this_00;
  reference pvVar2;
  const_reference pvVar3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  undefined4 extraout_var;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RCX;
  vector<Scope,_std::allocator<Scope>_> *in_RDI;
  Index a;
  Scope aI;
  Index k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Os;
  size_t nrAgents;
  vector<Scope,_std::allocator<Scope>_> *as;
  AlphaVectorPlanning *in_stack_ffffffffffffff48;
  Scope *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  value_type *in_stack_ffffffffffffff60;
  TreeIncPruneBGPlanner *in_stack_ffffffffffffff68;
  uint local_70;
  uint local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  size_type local_28;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_20;
  
  local_20 = in_RCX;
  local_28 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::size(in_RCX);
  GetObservationsFromDepth
            (in_stack_ffffffffffffff68,(Index)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0x9462aa);
  for (local_48 = 0; local_48 != local_28; local_48 = local_48 + 1) {
    Scope::Scope(in_stack_ffffffffffffff50);
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](local_20,(ulong)local_48);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_40,(ulong)local_48);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this_00,(ulong)*pvVar2);
    if (*pvVar3 == 0xffffffff) {
      local_70 = 0;
      while( true ) {
        in_stack_ffffffffffffff60 = (value_type *)(ulong)local_70;
        pPVar4 = AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff48);
        iVar1 = (*(pPVar4->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[7])
                          (pPVar4,(ulong)local_48);
        in_stack_ffffffffffffff58 = (value_type *)CONCAT44(extraout_var,iVar1);
        if (in_stack_ffffffffffffff60 == in_stack_ffffffffffffff58) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&in_stack_ffffffffffffff60->super_SDT,
                   (value_type_conflict1 *)in_stack_ffffffffffffff58);
        local_70 = local_70 + 1;
      }
    }
    else {
      in_stack_ffffffffffffff50 =
           (Scope *)std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](local_20,(ulong)local_48);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_40,(ulong)local_48);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (&in_stack_ffffffffffffff50->super_SDT,(ulong)*pvVar2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&in_stack_ffffffffffffff60->super_SDT,
                 (value_type_conflict1 *)in_stack_ffffffffffffff58);
    }
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    Scope::~Scope((Scope *)0x94640d);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            (&in_stack_ffffffffffffff60->super_SDT);
  return in_RDI;
}

Assistant:

vector<Scope> TreeIncPruneBGPlanner::GetValidActions(
    Index depth,
    const vector<vector<Index> > &jpol) const
{
    size_t nrAgents=jpol.size();

    vector<Index> Os=GetObservationsFromDepth(depth);
    vector<Scope> as;
    for(Index k=0;k!=nrAgents;++k)
    {
        Scope aI;
        if(jpol[k][Os[k]]==UNSPECIFIED_ACTION)
            // we didn't specify this obs yet, so all actions are valid
            for(Index a=0;a!=GetPU()->GetNrActions(k);++a)
                aI.push_back(a);
        else // we already assigned this obs, so we can only use that
             // particular action
            aI.push_back(jpol[k][Os[k]]);
        as.push_back(aI);
    }

    return(as);
}